

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ustar_filenames.c
# Opt level: O2

void test_filename(char *prefix,int dlen,int flen)

{
  int iVar1;
  mode_t mVar2;
  size_t sVar3;
  archive *paVar4;
  archive_entry *paVar5;
  char *pcVar6;
  long lVar7;
  longlong lVar8;
  int iVar9;
  wchar_t wVar10;
  long lVar11;
  archive_entry *local_2368;
  size_t used;
  char filename [400];
  char dirname [400];
  char buff [8192];
  
  iVar9 = 0;
  iVar1 = 0;
  if (prefix != (char *)0x0) {
    strcpy(filename,prefix);
    sVar3 = strlen(prefix);
    iVar1 = (int)sVar3;
  }
  if (0 < dlen) {
    lVar11 = (long)iVar1;
    lVar7 = lVar11 << 0x20;
    for (; iVar1 = iVar1 + 1, lVar11 < (long)(ulong)(uint)dlen; lVar11 = lVar11 + 1) {
      filename[lVar11] = 'a';
      lVar7 = lVar7 + 0x100000000;
    }
    filename[lVar7 >> 0x20] = '/';
    iVar9 = 1;
  }
  lVar11 = (long)iVar1;
  lVar7 = lVar11 << 0x20;
  for (; lVar11 < iVar9 + flen + dlen; lVar11 = lVar11 + 1) {
    filename[lVar11] = 'b';
    lVar7 = lVar7 + 0x100000000;
  }
  filename[lVar7 >> 0x20] = '\0';
  strcpy(dirname,filename);
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'=',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'>',(uint)(iVar1 == 0),"0 == archive_write_set_format_ustar(a)",paVar4);
  iVar1 = archive_write_add_filter_none(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'?',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",paVar4);
  iVar1 = archive_write_set_bytes_per_block(paVar4,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'@',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_per_block(a,0)",paVar4);
  iVar1 = archive_write_open_memory(paVar4,buff,0x2000,&used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'A',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar4);
  paVar5 = archive_entry_new();
  local_2368 = paVar5;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'F',(uint)(paVar5 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar5,filename);
  archive_entry_set_mode(paVar5,0x81ed);
  failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
  iVar1 = archive_write_header(paVar4,paVar5);
  if (flen < 0x65) {
    pcVar6 = "0";
    wVar10 = L'M';
    lVar8 = 0;
  }
  else {
    pcVar6 = "ARCHIVE_FAILED";
    wVar10 = L'K';
    lVar8 = -0x19;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,wVar10,lVar8,pcVar6,(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(paVar5);
  paVar5 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'T',(uint)(paVar5 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar5,dirname);
  archive_entry_set_mode(paVar5,0x41ed);
  failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
  iVar1 = archive_write_header(paVar4,paVar5);
  if (flen < 100) {
    pcVar6 = "0";
    wVar10 = L'[';
    lVar8 = 0;
  }
  else {
    pcVar6 = "ARCHIVE_FAILED";
    wVar10 = L'Y';
    lVar8 = -0x19;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,wVar10,lVar8,pcVar6,(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(paVar5);
  sVar3 = strlen(dirname);
  (dirname + sVar3)[0] = '/';
  (dirname + sVar3)[1] = '\0';
  paVar5 = archive_entry_new();
  local_2368 = paVar5;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'e',(uint)(paVar5 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar5,dirname);
  archive_entry_set_mode(paVar5,0x41ed);
  failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
  iVar1 = archive_write_header(paVar4,paVar5);
  if (flen < 100) {
    pcVar6 = "0";
    wVar10 = L'l';
    lVar8 = 0;
  }
  else {
    pcVar6 = "ARCHIVE_FAILED";
    wVar10 = L'j';
    lVar8 = -0x19;
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,wVar10,lVar8,pcVar6,(long)iVar1,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(paVar5);
  iVar1 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'q',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar4);
  iVar1 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'r',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'w',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'x',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",paVar4);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'y',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",paVar4);
  iVar1 = archive_read_open_memory(paVar4,buff,used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                   ,L'z',(uint)(iVar1 == 0),"0 == archive_read_open_memory(a, buff, used)",paVar4);
  if (flen < 0x65) {
    iVar1 = archive_read_next_header(paVar4,&local_2368);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                     ,L'~',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar4);
    failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
    pcVar6 = archive_entry_pathname(local_2368);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
               ,L'\x80',filename,"filename",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    mVar2 = archive_entry_mode(local_2368);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                        ,L'\x81',0x81ed,"(S_IFREG | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
    if (flen != 100) {
      iVar1 = archive_read_next_header(paVar4,&local_2368);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                       ,L'\x8c',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar4);
      mVar2 = archive_entry_mode(local_2368);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                       ,L'\x8d',(uint)(mVar2 == 0x41ed),"(S_IFDIR | 0755) == archive_entry_mode(ae)"
                       ,(void *)0x0);
      failure("dlen=%d, flen=%d",(ulong)(uint)dlen,(ulong)(uint)flen);
      pcVar6 = archive_entry_pathname(local_2368);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                 ,L'\x8f',dirname,"dirname",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      iVar1 = archive_read_next_header(paVar4,&local_2368);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                       ,L'\x93',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",paVar4);
      mVar2 = archive_entry_mode(local_2368);
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                       ,L'\x94',(uint)(mVar2 == 0x41ed),"(S_IFDIR | 0755) == archive_entry_mode(ae)"
                       ,(void *)0x0);
      pcVar6 = archive_entry_pathname(local_2368);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                 ,L'\x95',dirname,"dirname",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    }
  }
  failure("This fails if entries were written that should not have been written.  dlen=%d, flen=%d",
          (ulong)(uint)dlen,(ulong)(uint)flen);
  iVar1 = archive_read_next_header(paVar4,&local_2368);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'\x9a',1,"1",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  iVar1 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'\x9b',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_ustar_filenames.c"
                      ,L'\x9c',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_filename(const char *prefix, int dlen, int flen)
{
	char buff[8192];
	char filename[400];
	char dirname[400];
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	int separator = 0;
	int i = 0;

	if (prefix != NULL) {
		strcpy(filename, prefix);
		i = (int)strlen(prefix);
	}
	if (dlen > 0) {
		for (; i < dlen; i++)
			filename[i] = 'a';
		filename[i++] = '/';
		separator = 1;
	}
	for (; i < dlen + flen + separator; i++)
		filename[i] = 'b';
	filename[i] = '\0';

	strcpy(dirname, filename);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_ustar(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_bytes_per_block(a,0));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, filename);
	archive_entry_set_mode(ae, S_IFREG | 0755);
	failure("dlen=%d, flen=%d", dlen, flen);
	if (flen > 100) {
		assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	} else {
		assertEqualIntA(a, 0, archive_write_header(a, ae));
	}
	archive_entry_free(ae);

	/*
	 * Write a dir to it (without trailing '/').
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, dirname);
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	failure("dlen=%d, flen=%d", dlen, flen);
	if (flen >= 100) {
		assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	} else {
		assertEqualIntA(a, 0, archive_write_header(a, ae));
	}
	archive_entry_free(ae);

	/* Tar adds a '/' to directory names. */
	strcat(dirname, "/");

	/*
	 * Write a dir to it (with trailing '/').
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, dirname);
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	failure("dlen=%d, flen=%d", dlen, flen);
	if (flen >= 100) {
		assertEqualIntA(a, ARCHIVE_FAILED, archive_write_header(a, ae));
	} else {
		assertEqualIntA(a, 0, archive_write_header(a, ae));
	}
	archive_entry_free(ae);

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Now, read the data back.
	 */
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff, used));

	if (flen <= 100) {
		/* Read the file and check the filename. */
		assertA(0 == archive_read_next_header(a, &ae));
		failure("dlen=%d, flen=%d", dlen, flen);
		assertEqualString(filename, archive_entry_pathname(ae));
		assertEqualInt((S_IFREG | 0755), archive_entry_mode(ae));
	}

	/*
	 * Read the two dirs and check the names.
	 *
	 * Both dirs should read back with the same name, since
	 * tar should add a trailing '/' to any dir that doesn't
	 * already have one.
	 */
	if (flen <= 99) {
		assertA(0 == archive_read_next_header(a, &ae));
		assert((S_IFDIR | 0755) == archive_entry_mode(ae));
		failure("dlen=%d, flen=%d", dlen, flen);
		assertEqualString(dirname, archive_entry_pathname(ae));
	}

	if (flen <= 99) {
		assertA(0 == archive_read_next_header(a, &ae));
		assert((S_IFDIR | 0755) == archive_entry_mode(ae));
		assertEqualString(dirname, archive_entry_pathname(ae));
	}

	/* Verify the end of the archive. */
	failure("This fails if entries were written that should not have been written.  dlen=%d, flen=%d", dlen, flen);
	assertEqualInt(1, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}